

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  secp256k1_ge aggnonce_pts [2];
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_callback *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe60;
  secp256k1_gej *in_stack_fffffffffffffe68;
  secp256k1_ge *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffee0;
  secp256k1_musig_pubnonce **in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  secp256k1_context *in_stack_fffffffffffffef8;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_musig_sum_pubnonces
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                       ,in_stack_fffffffffffffee0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_ge_set_all_gej_var
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      secp256k1_musig_aggnonce_save
                ((secp256k1_musig_aggnonce *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}